

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_chroma_intra_pred_filters_ssse3_intr.c
# Opt level: O3

void ihevc_intra_pred_chroma_horz_ssse3
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  UWORD8 *pUVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  long lVar6;
  bool bVar7;
  ulong uVar8;
  UWORD8 *pUVar9;
  undefined4 uVar10;
  undefined1 auVar11 [16];
  undefined4 uVar12;
  undefined1 auVar13 [16];
  undefined4 uVar14;
  undefined1 auVar15 [16];
  undefined4 uVar16;
  undefined1 auVar17 [16];
  
  if (nt == 8) {
    lVar6 = (long)dst_strd;
    uVar8 = 0;
    bVar5 = true;
    do {
      bVar7 = bVar5;
      uVar2 = uVar8 * 2 + 2;
      uVar3 = uVar8 * 2 + 4;
      uVar4 = uVar8 * 2 + 6;
      auVar11 = pshuflw(ZEXT216(CONCAT11(pu1_ref[uVar8 * 2 ^ 0x1f],pu1_ref[uVar8 * -2 + 0x1e])),
                        ZEXT216(CONCAT11(pu1_ref[uVar8 * 2 ^ 0x1f],pu1_ref[uVar8 * -2 + 0x1e])),0);
      uVar10 = auVar11._0_4_;
      auVar11 = pshuflw(ZEXT216(CONCAT11(pu1_ref[uVar2 ^ 0x1f],pu1_ref[0x1e - uVar2])),
                        ZEXT216(CONCAT11(pu1_ref[uVar2 ^ 0x1f],pu1_ref[0x1e - uVar2])),0);
      uVar12 = auVar11._0_4_;
      auVar11 = pshuflw(ZEXT216(CONCAT11(pu1_ref[uVar3 ^ 0x1f],pu1_ref[0x1e - uVar3])),
                        ZEXT216(CONCAT11(pu1_ref[uVar3 ^ 0x1f],pu1_ref[0x1e - uVar3])),0);
      uVar14 = auVar11._0_4_;
      auVar11 = pshuflw(ZEXT216(CONCAT11(pu1_ref[uVar4 ^ 0x1f],pu1_ref[0x1e - uVar4])),
                        ZEXT216(CONCAT11(pu1_ref[uVar4 ^ 0x1f],pu1_ref[0x1e - uVar4])),0);
      uVar16 = auVar11._0_4_;
      pUVar9 = pu1_dst + uVar8 * lVar6;
      *(undefined4 *)pUVar9 = uVar10;
      *(undefined4 *)(pUVar9 + 4) = uVar10;
      *(undefined4 *)(pUVar9 + 8) = uVar10;
      *(undefined4 *)(pUVar9 + 0xc) = uVar10;
      pUVar9 = pu1_dst + (uVar8 | 1) * lVar6;
      *(undefined4 *)pUVar9 = uVar12;
      *(undefined4 *)(pUVar9 + 4) = uVar12;
      *(undefined4 *)(pUVar9 + 8) = uVar12;
      *(undefined4 *)(pUVar9 + 0xc) = uVar12;
      pUVar9 = pu1_dst + (uVar8 | 2) * lVar6;
      *(undefined4 *)pUVar9 = uVar14;
      *(undefined4 *)(pUVar9 + 4) = uVar14;
      *(undefined4 *)(pUVar9 + 8) = uVar14;
      *(undefined4 *)(pUVar9 + 0xc) = uVar14;
      pUVar9 = pu1_dst + (uVar8 | 3) * lVar6;
      *(undefined4 *)pUVar9 = uVar16;
      *(undefined4 *)(pUVar9 + 4) = uVar16;
      *(undefined4 *)(pUVar9 + 8) = uVar16;
      *(undefined4 *)(pUVar9 + 0xc) = uVar16;
      uVar8 = 4;
      bVar5 = false;
    } while (bVar7);
  }
  else if (nt == 0x10) {
    lVar6 = (long)dst_strd;
    pUVar9 = pu1_ref + 0x3f;
    uVar8 = 0xfffffffffffffffc;
    do {
      auVar11 = pshuflw(ZEXT216(CONCAT11(*pUVar9,pUVar9[-1])),ZEXT216(CONCAT11(*pUVar9,pUVar9[-1])),
                        0);
      uVar10 = auVar11._0_4_;
      auVar11 = pshuflw(ZEXT216(*(ushort *)(pUVar9 + -3)),ZEXT216(*(ushort *)(pUVar9 + -3)),0);
      uVar12 = auVar11._0_4_;
      auVar11 = pshuflw(ZEXT216(*(ushort *)(pUVar9 + -5)),ZEXT216(*(ushort *)(pUVar9 + -5)),0);
      uVar14 = auVar11._0_4_;
      auVar11 = pshuflw(ZEXT216(*(ushort *)(pUVar9 + -7)),ZEXT216(*(ushort *)(pUVar9 + -7)),0);
      uVar16 = auVar11._0_4_;
      *(undefined4 *)pu1_dst = uVar10;
      *(undefined4 *)(pu1_dst + 4) = uVar10;
      *(undefined4 *)(pu1_dst + 8) = uVar10;
      *(undefined4 *)(pu1_dst + 0xc) = uVar10;
      *(undefined4 *)(pu1_dst + 0x10) = uVar10;
      *(undefined4 *)(pu1_dst + 0x14) = uVar10;
      *(undefined4 *)(pu1_dst + 0x18) = uVar10;
      *(undefined4 *)(pu1_dst + 0x1c) = uVar10;
      pUVar1 = pu1_dst + lVar6;
      *(undefined4 *)pUVar1 = uVar12;
      *(undefined4 *)(pUVar1 + 4) = uVar12;
      *(undefined4 *)(pUVar1 + 8) = uVar12;
      *(undefined4 *)(pUVar1 + 0xc) = uVar12;
      pUVar1 = pu1_dst + lVar6 + 0x10;
      *(undefined4 *)pUVar1 = uVar12;
      *(undefined4 *)(pUVar1 + 4) = uVar12;
      *(undefined4 *)(pUVar1 + 8) = uVar12;
      *(undefined4 *)(pUVar1 + 0xc) = uVar12;
      pUVar1 = pu1_dst + lVar6 * 2;
      *(undefined4 *)pUVar1 = uVar14;
      *(undefined4 *)(pUVar1 + 4) = uVar14;
      *(undefined4 *)(pUVar1 + 8) = uVar14;
      *(undefined4 *)(pUVar1 + 0xc) = uVar14;
      pUVar1 = pu1_dst + lVar6 * 2 + 0x10;
      *(undefined4 *)pUVar1 = uVar14;
      *(undefined4 *)(pUVar1 + 4) = uVar14;
      *(undefined4 *)(pUVar1 + 8) = uVar14;
      *(undefined4 *)(pUVar1 + 0xc) = uVar14;
      pUVar1 = pu1_dst + lVar6 * 3;
      *(undefined4 *)pUVar1 = uVar16;
      *(undefined4 *)(pUVar1 + 4) = uVar16;
      *(undefined4 *)(pUVar1 + 8) = uVar16;
      *(undefined4 *)(pUVar1 + 0xc) = uVar16;
      pUVar1 = pu1_dst + lVar6 * 3 + 0x10;
      *(undefined4 *)pUVar1 = uVar16;
      *(undefined4 *)(pUVar1 + 4) = uVar16;
      *(undefined4 *)(pUVar1 + 8) = uVar16;
      *(undefined4 *)(pUVar1 + 0xc) = uVar16;
      uVar8 = uVar8 + 4;
      pu1_dst = pu1_dst + lVar6 * 4;
      pUVar9 = pUVar9 + -8;
    } while (uVar8 < 0xc);
  }
  else {
    lVar6 = (long)nt;
    auVar11 = pshuflw(ZEXT216(CONCAT11(pu1_ref[lVar6 * 4 + -1],pu1_ref[lVar6 * 4 + -2])),
                      ZEXT216(CONCAT11(pu1_ref[lVar6 * 4 + -1],pu1_ref[lVar6 * 4 + -2])),0);
    auVar13 = pshuflw(ZEXT216(CONCAT11(pu1_ref[lVar6 * 4 + -3],pu1_ref[lVar6 * 4 + -4])),
                      ZEXT216(CONCAT11(pu1_ref[lVar6 * 4 + -3],pu1_ref[lVar6 * 4 + -4])),0);
    auVar15 = pshuflw(ZEXT216(CONCAT11(pu1_ref[lVar6 * 4 + -5],pu1_ref[lVar6 * 4 + -6])),
                      ZEXT216(CONCAT11(pu1_ref[lVar6 * 4 + -5],pu1_ref[lVar6 * 4 + -6])),0);
    auVar17 = pshuflw(ZEXT216(CONCAT11(pu1_ref[lVar6 * 4 + -7],pu1_ref[lVar6 * 4 + -8])),
                      ZEXT216(CONCAT11(pu1_ref[lVar6 * 4 + -7],pu1_ref[lVar6 * 4 + -8])),0);
    *(long *)pu1_dst = auVar11._0_8_;
    lVar6 = (long)dst_strd;
    *(long *)(pu1_dst + lVar6) = auVar13._0_8_;
    *(long *)(pu1_dst + lVar6 * 2) = auVar15._0_8_;
    *(long *)(pu1_dst + lVar6 * 3) = auVar17._0_8_;
  }
  return;
}

Assistant:

void ihevc_intra_pred_chroma_horz_ssse3(UWORD8 *pu1_ref,
                                        WORD32 src_strd,
                                        UWORD8 *pu1_dst,
                                        WORD32 dst_strd,
                                        WORD32 nt,
                                        WORD32 mode)
{

    WORD32 row;
    __m128i temp1, temp2, temp3, temp4, temp5, temp6,  temp7, temp8;
    UNUSED(src_strd);
    UNUSED(mode);

    /* Replication to next rows*/

    if(nt == 8)
    {
        for(row = 0; row < nt; row += 4)
        {
            temp1 = _mm_set1_epi8(pu1_ref[(4 * nt) - 2 - 2 * (row + 0)]);
            temp2 = _mm_set1_epi8(pu1_ref[(4 * nt) - 1 - 2 * (row + 0)]);
            temp3 = _mm_set1_epi8(pu1_ref[(4 * nt) - 2 - 2 * (row + 1)]);
            temp4 = _mm_set1_epi8(pu1_ref[(4 * nt) - 1 - 2 * (row + 1)]);
            temp5 = _mm_set1_epi8(pu1_ref[(4 * nt) - 2 - 2 * (row + 2)]);
            temp6 = _mm_set1_epi8(pu1_ref[(4 * nt) - 1 - 2 * (row + 2)]);
            temp7 = _mm_set1_epi8(pu1_ref[(4 * nt) - 2 - 2 * (row + 3)]);
            temp8 = _mm_set1_epi8(pu1_ref[(4 * nt) - 1 - 2 * (row + 3)]);

            temp2 = _mm_unpacklo_epi8(temp1, temp2);
            temp4 = _mm_unpacklo_epi8(temp3, temp4);
            temp6 = _mm_unpacklo_epi8(temp5, temp6);
            temp8 = _mm_unpacklo_epi8(temp7, temp8);

            _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 0) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 1) * dst_strd)), temp4);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 2) * dst_strd)), temp6);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 3) * dst_strd)), temp8);

        }
    }
    else if(nt == 16)
    {
        for(row = 0; row < nt; row += 4)
        {
            temp1 = _mm_set1_epi8(pu1_ref[(4 * nt) - 2 - 2 * (row + 0)]);
            temp2 = _mm_set1_epi8(pu1_ref[(4 * nt) - 1 - 2 * (row + 0)]);

            temp3 = _mm_set1_epi8(pu1_ref[(4 * nt) - 2 - 2 * (row + 1)]);
            temp4 = _mm_set1_epi8(pu1_ref[(4 * nt) - 1 - 2 * (row + 1)]);

            temp5 = _mm_set1_epi8(pu1_ref[(4 * nt) - 2 - 2 * (row + 2)]);
            temp6 = _mm_set1_epi8(pu1_ref[(4 * nt) - 1 - 2 * (row + 2)]);

            temp7 = _mm_set1_epi8(pu1_ref[(4 * nt) - 2 - 2 * (row + 3)]);
            temp8 = _mm_set1_epi8(pu1_ref[(4 * nt) - 1 - 2 * (row + 3)]);

            temp2 = _mm_unpacklo_epi8(temp1, temp2);
            temp4 = _mm_unpacklo_epi8(temp3, temp4);
            temp6 = _mm_unpacklo_epi8(temp5, temp6);
            temp8 = _mm_unpacklo_epi8(temp7, temp8);

            _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 0) * dst_strd) + 0), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 0) * dst_strd) + 16), temp2);

            _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 1) * dst_strd) + 0), temp4);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 1) * dst_strd) + 16), temp4);

            _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 2) * dst_strd) + 0), temp6);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 2) * dst_strd) + 16), temp6);

            _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 3) * dst_strd) + 0), temp8);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 3) * dst_strd) + 16), temp8);


        }
    }
    else
    {
        temp1 = _mm_set1_epi8(pu1_ref[(4 * nt) - 2 - 2 * 0]);
        temp2 = _mm_set1_epi8(pu1_ref[(4 * nt) - 1 - 2 * 0]);

        temp3 = _mm_set1_epi8(pu1_ref[(4 * nt) - 2 - 2 * 1]);
        temp4 = _mm_set1_epi8(pu1_ref[(4 * nt) - 1 - 2 * 1]);

        temp5 = _mm_set1_epi8(pu1_ref[(4 * nt) - 2 - 2 * 2]);
        temp6 = _mm_set1_epi8(pu1_ref[(4 * nt) - 1 - 2 * 2]);

        temp7 = _mm_set1_epi8(pu1_ref[(4 * nt) - 2 - 2 * 3]);
        temp8 = _mm_set1_epi8(pu1_ref[(4 * nt) - 1 - 2 * 3]);

        temp2 = _mm_unpacklo_epi8(temp1, temp2);
        temp4 = _mm_unpacklo_epi8(temp3, temp4);
        temp6 = _mm_unpacklo_epi8(temp5, temp6);
        temp8 = _mm_unpacklo_epi8(temp7, temp8);

        _mm_storel_epi64((__m128i *)(pu1_dst + (0 * dst_strd)), temp2);
        _mm_storel_epi64((__m128i *)(pu1_dst + (1 * dst_strd)), temp4);
        _mm_storel_epi64((__m128i *)(pu1_dst + (2 * dst_strd)), temp6);
        _mm_storel_epi64((__m128i *)(pu1_dst + (3 * dst_strd)), temp8);
    }
}